

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# physfs_lzmasdk.h
# Opt level: O0

void SzArEx_Free(CSzArEx *p,ISzAlloc *alloc)

{
  ISzAlloc *alloc_local;
  CSzArEx *p_local;
  
  (*alloc->Free)(alloc,p->UnpackPositions);
  (*alloc->Free)(alloc,p->IsDirs);
  (*alloc->Free)(alloc,p->FolderToFile);
  (*alloc->Free)(alloc,p->FileToFolder);
  (*alloc->Free)(alloc,p->FileNameOffsets);
  (*alloc->Free)(alloc,p->FileNames);
  SzBitUi32s_Free(&p->CRCs,alloc);
  SzBitUi32s_Free(&p->Attribs,alloc);
  SzBitUi64s_Free(&p->MTime,alloc);
  SzBitUi64s_Free(&p->CTime,alloc);
  SzAr_Free(&p->db,alloc);
  SzArEx_Init(p);
  return;
}

Assistant:

static void SzArEx_Free(CSzArEx *p, ISzAlloc *alloc)
{
  IAlloc_Free(alloc, p->UnpackPositions);
  IAlloc_Free(alloc, p->IsDirs);

  IAlloc_Free(alloc, p->FolderToFile);
  IAlloc_Free(alloc, p->FileToFolder);

  IAlloc_Free(alloc, p->FileNameOffsets);
  IAlloc_Free(alloc, p->FileNames);

  SzBitUi32s_Free(&p->CRCs, alloc);
  SzBitUi32s_Free(&p->Attribs, alloc);
  /* SzBitUi32s_Free(&p->Parents, alloc); */
  SzBitUi64s_Free(&p->MTime, alloc);
  SzBitUi64s_Free(&p->CTime, alloc);
  
  SzAr_Free(&p->db, alloc);
  SzArEx_Init(p);
}